

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O3

int can_sjw_check(net_device *dev,can_bittiming *bt,can_bittiming_const *btc,netlink_ext_ack *extack
                 )

{
  uint uVar1;
  int iVar2;
  
  uVar1 = bt->sjw;
  iVar2 = -0x16;
  if (((uVar1 <= btc->sjw_max) && (uVar1 <= bt->phase_seg1)) &&
     (iVar2 = -0x16, uVar1 <= bt->phase_seg2)) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int can_sjw_check(const struct net_device *dev, const struct can_bittiming *bt,
		  const struct can_bittiming_const *btc, struct netlink_ext_ack *extack)
{
	if (bt->sjw > btc->sjw_max) {
		NL_SET_ERR_MSG_FMT(extack, "sjw: %u greater than max sjw: %u",
				   bt->sjw, btc->sjw_max);
		return -EINVAL;
	}

	if (bt->sjw > bt->phase_seg1) {
		NL_SET_ERR_MSG_FMT(extack,
				   "sjw: %u greater than phase-seg1: %u",
				   bt->sjw, bt->phase_seg1);
		return -EINVAL;
	}

	if (bt->sjw > bt->phase_seg2) {
		NL_SET_ERR_MSG_FMT(extack,
				   "sjw: %u greater than phase-seg2: %u",
				   bt->sjw, bt->phase_seg2);
		return -EINVAL;
	}

	return 0;
}